

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_rect_pack.h
# Opt level: O3

int stbrp_pack_rects(stbrp_context *context,stbrp_rect *rects,int num_rects)

{
  stbrp_rect *psVar1;
  stbrp_node **ppsVar2;
  ushort uVar3;
  ushort uVar4;
  ushort uVar5;
  stbrp_node *psVar6;
  undefined1 auVar7 [16];
  stbrp_context *psVar8;
  uint uVar9;
  int iVar10;
  int extraout_EAX;
  stbrp_node **ppsVar11;
  long extraout_RAX;
  long lVar12;
  int *piVar13;
  undefined4 in_register_00000014;
  ulong uVar14;
  stbrp_node *psVar15;
  uint uVar16;
  stbrp_node **ppsVar17;
  uint uVar18;
  stbrp_node *in_R8;
  stbrp_node *psVar19;
  size_t sVar20;
  stbrp_context *psVar21;
  stbrp_context *psVar22;
  ulong uVar23;
  int iVar24;
  uint uVar25;
  undefined1 auVar26 [16];
  undefined1 auVar27 [16];
  undefined1 auVar28 [16];
  int waste;
  uint local_90;
  int local_8c;
  stbrp_node **local_80;
  int local_70;
  int local_6c;
  undefined8 local_68;
  ulong local_60;
  stbrp_rect *local_58;
  stbrp_rect *local_50;
  size_t local_48;
  stbrp_context *local_40;
  ulong local_38;
  
  auVar7 = _DAT_001aaa50;
  if (num_rects < 1) {
    uVar23 = (ulong)num_rects;
    qsort(rects,uVar23,0x10,rect_height_compare);
  }
  else {
    uVar23 = (ulong)(uint)num_rects;
    lVar12 = uVar23 - 1;
    auVar26._8_4_ = (int)lVar12;
    auVar26._0_8_ = lVar12;
    auVar26._12_4_ = (int)((ulong)lVar12 >> 0x20);
    piVar13 = &rects[1].was_packed;
    uVar14 = 0;
    auVar26 = auVar26 ^ _DAT_001aaa50;
    auVar27 = _DAT_001aaa40;
    do {
      auVar28 = auVar27 ^ auVar7;
      if ((bool)(~(auVar28._4_4_ == auVar26._4_4_ && auVar26._0_4_ < auVar28._0_4_ ||
                  auVar26._4_4_ < auVar28._4_4_) & 1)) {
        piVar13[-4] = (int)uVar14;
      }
      if ((auVar28._12_4_ != auVar26._12_4_ || auVar28._8_4_ <= auVar26._8_4_) &&
          auVar28._12_4_ <= auVar26._12_4_) {
        *piVar13 = (int)uVar14 + 1;
      }
      uVar14 = uVar14 + 2;
      lVar12 = auVar27._8_8_;
      auVar27._0_8_ = auVar27._0_8_ + 2;
      auVar27._8_8_ = lVar12 + 2;
      piVar13 = piVar13 + 8;
    } while ((num_rects + 1U & 0xfffffffe) != uVar14);
    local_68 = CONCAT44(in_register_00000014,num_rects);
    qsort(rects,uVar23,0x10,rect_height_compare);
    if (0 < (int)local_68) {
      ppsVar2 = &context->active_head;
      sVar20 = 0;
      local_60 = uVar23;
      local_58 = rects;
      local_40 = context;
      do {
        psVar1 = rects + sVar20;
        uVar3 = rects[sVar20].w;
        if ((uVar3 == 0) || (uVar4 = psVar1->h, uVar4 == 0)) {
          psVar1->x = 0;
          psVar1->y = 0;
        }
        else {
          iVar10 = context->align;
          iVar24 = (uint)uVar3 + iVar10 + -1;
          uVar25 = iVar24 - iVar24 % iVar10;
          if ((int)uVar25 % iVar10 != 0) {
            __assert_fail("width % c->align == 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                          ,0x15e,
                          "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                         );
          }
          uVar5 = *(ushort *)&((stbrp_context *)context->active_head)->width;
          local_50 = psVar1;
          local_48 = sVar20;
          local_38 = (ulong)uVar3;
          if (context->width < (int)(uVar25 + uVar5)) {
            iVar10 = context->heuristic;
            local_8c = 0x40000000;
            uVar18 = 0x40000000;
LAB_0017fa2f:
            local_80 = (stbrp_node **)0x0;
            local_90 = 0;
          }
          else {
            local_8c = 0x40000000;
            local_80 = (stbrp_node **)0x0;
            uVar18 = 0x40000000;
            ppsVar17 = ppsVar2;
            psVar22 = (stbrp_context *)context->active_head;
            do {
              uVar16 = stbrp__skyline_find_min_y
                                 (psVar22,(stbrp_node *)(ulong)uVar5,uVar25,(int)&local_6c,
                                  (int *)in_R8);
              iVar10 = context->heuristic;
              if (iVar10 == 0) {
                if ((int)uVar16 < (int)uVar18) {
                  local_80 = ppsVar17;
                  uVar18 = uVar16;
                }
              }
              else if (((int)(uVar4 + uVar16) <= context->height) &&
                      (((int)uVar16 < (int)uVar18 || (local_6c < local_8c && uVar16 == uVar18)))) {
                local_8c = local_6c;
                local_80 = ppsVar17;
                uVar18 = uVar16;
              }
              ppsVar17 = (stbrp_node **)&psVar22->align;
              uVar5 = (ushort)(*(stbrp_context **)&psVar22->align)->width;
              psVar22 = *(stbrp_context **)&psVar22->align;
            } while ((int)(uVar25 + uVar5) <= context->width);
            if (local_80 == (stbrp_node **)0x0) goto LAB_0017fa2f;
            local_90 = (uint)(*local_80)->x;
          }
          if (iVar10 == 1) {
            psVar22 = (stbrp_context *)*ppsVar2;
            ppsVar17 = ppsVar2;
            psVar21 = psVar22;
            if ((int)(uint)(ushort)psVar22->width < (int)uVar25) {
              do {
                psVar21 = *(stbrp_context **)&psVar21->align;
              } while ((ushort)psVar21->width < uVar25);
            }
            do {
              uVar16 = (ushort)psVar21->width - uVar25;
              psVar8 = psVar22;
              if ((int)uVar16 < 0) {
                __assert_fail("xpos >= 0",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                              ,0x197,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              do {
                psVar22 = psVar8;
                ppsVar11 = ppsVar17;
                ppsVar17 = (stbrp_node **)&psVar22->align;
                psVar8 = *(stbrp_context **)&psVar22->align;
              } while ((ushort)(*(stbrp_context **)&psVar22->align)->width <= uVar16);
              if (uVar16 < (ushort)psVar22->width) {
                __assert_fail("node->next->x > xpos && node->x <= xpos",
                              "/workspace/llm4binary/github/license_c_cmakelists/jdupuy[P]opengl-framework/submodules/imgui/stb_rect_pack.h"
                              ,0x19d,
                              "stbrp__findresult stbrp__skyline_find_best_pos(stbrp_context *, int, int)"
                             );
              }
              uVar9 = stbrp__skyline_find_min_y
                                (psVar22,(stbrp_node *)(ulong)uVar16,uVar25,(int)&local_70,
                                 (int *)in_R8);
              if ((((int)(uVar4 + uVar9) < local_40->height) && ((int)uVar9 <= (int)uVar18)) &&
                 (((uVar9 < uVar18 || (local_70 < local_8c)) ||
                  ((local_70 == local_8c && ((int)uVar16 < (int)local_90)))))) {
                local_8c = local_70;
                uVar18 = uVar9;
                local_90 = uVar16;
                local_80 = ppsVar11;
              }
              piVar13 = &psVar21->align;
              ppsVar17 = ppsVar11;
              psVar21 = *(stbrp_context **)piVar13;
            } while (*(stbrp_context **)piVar13 != (stbrp_context *)0x0);
          }
          rects = local_58;
          sVar20 = local_48;
          context = local_40;
          uVar23 = local_60;
          if (((local_80 == (stbrp_node **)0x0) ||
              (iVar10 = uVar4 + uVar18, local_40->height < iVar10)) ||
             (psVar6 = local_40->free_head, psVar6 == (stbrp_node *)0x0)) {
            local_50->x = 0xffff;
            local_50->y = 0xffff;
          }
          else {
            psVar6->x = (stbrp_coord)local_90;
            psVar6->y = (stbrp_coord)iVar10;
            local_40->free_head = psVar6->next;
            psVar15 = *local_80;
            if ((int)(uint)psVar15->x < (int)local_90) {
              local_80 = &psVar15->next;
              psVar15 = psVar15->next;
            }
            *local_80 = psVar6;
            in_R8 = psVar15->next;
            iVar10 = local_90 + (int)local_38;
            if (in_R8 != (stbrp_node *)0x0) {
              do {
                psVar19 = in_R8;
                in_R8 = (stbrp_node *)(ulong)psVar19->x;
                if (iVar10 < (int)(uint)psVar19->x) goto LAB_0017fbd9;
                psVar15->next = local_40->free_head;
                local_40->free_head = psVar15;
                psVar15 = psVar19;
                in_R8 = psVar19->next;
              } while (psVar19->next != (stbrp_node *)0x0);
              in_R8 = (stbrp_node *)0x0;
            }
LAB_0017fbd9:
            psVar6->next = psVar15;
            if ((int)(uint)psVar15->x < iVar10) {
              psVar15->x = (stbrp_coord)iVar10;
            }
            local_50->x = (stbrp_coord)local_90;
            local_50->y = (stbrp_coord)uVar18;
          }
        }
        sVar20 = sVar20 + 1;
        if (sVar20 == uVar23) {
          qsort(rects,uVar23,0x10,rect_original_order);
          lVar12 = extraout_RAX;
          if (0 < (int)local_68) {
            lVar12 = 0;
            do {
              uVar25 = 1;
              if (*(short *)((long)&rects->x + lVar12) == -1) {
                uVar25 = (uint)(*(short *)((long)&rects->y + lVar12) != -1);
              }
              *(uint *)((long)&rects->was_packed + lVar12) = uVar25;
              lVar12 = lVar12 + 0x10;
            } while (uVar23 * 0x10 != lVar12);
          }
          return (int)lVar12;
        }
      } while( true );
    }
  }
  qsort(rects,uVar23,0x10,rect_original_order);
  return extraout_EAX;
}

Assistant:

STBRP_DEF int stbrp_pack_rects(stbrp_context *context, stbrp_rect *rects, int num_rects)
{
   int i, all_rects_packed = 1;

   // we use the 'was_packed' field internally to allow sorting/unsorting
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = i;
      #ifndef STBRP_LARGE_RECTS
      STBRP_ASSERT(rects[i].w <= 0xffff && rects[i].h <= 0xffff);
      #endif
   }

   // sort according to heuristic
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_height_compare);

   for (i=0; i < num_rects; ++i) {
      if (rects[i].w == 0 || rects[i].h == 0) {
         rects[i].x = rects[i].y = 0;  // empty rect needs no space
      } else {
         stbrp__findresult fr = stbrp__skyline_pack_rectangle(context, rects[i].w, rects[i].h);
         if (fr.prev_link) {
            rects[i].x = (stbrp_coord) fr.x;
            rects[i].y = (stbrp_coord) fr.y;
         } else {
            rects[i].x = rects[i].y = STBRP__MAXVAL;
         }
      }
   }

   // unsort
   STBRP_SORT(rects, num_rects, sizeof(rects[0]), rect_original_order);

   // set was_packed flags and all_rects_packed status
   for (i=0; i < num_rects; ++i) {
      rects[i].was_packed = !(rects[i].x == STBRP__MAXVAL && rects[i].y == STBRP__MAXVAL);
      if (!rects[i].was_packed)
         all_rects_packed = 0;
   }

   // return the all_rects_packed status
   return all_rects_packed;
}